

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mul.c
# Opt level: O0

unsigned_long bn_add_part_words(unsigned_long *r,unsigned_long *a,unsigned_long *b,int cl,int dl)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int in_ECX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  int in_R8D;
  int save_dl_1;
  int save_dl;
  unsigned_long t;
  unsigned_long l;
  unsigned_long c;
  ulong local_30;
  int local_28;
  ulong *local_20;
  ulong *local_18;
  ulong *local_10;
  
  local_30 = bn_add_words(in_RDI,in_RSI,in_RDX,in_ECX);
  if (in_R8D == 0) {
    return local_30;
  }
  local_10 = in_RDI + in_ECX;
  local_18 = in_RSI + in_ECX;
  local_20 = in_RDX + in_ECX;
  local_28 = in_R8D;
  if (-1 < in_R8D) {
    while (iVar2 = local_28, iVar1 = local_28, local_30 != 0) {
      uVar3 = *local_18 + local_30;
      local_30 = (ulong)(int)(uint)(uVar3 < local_30);
      *local_10 = uVar3;
      iVar1 = local_28 + -1;
      if (local_28 + -1 < 1) break;
      uVar3 = local_18[1] + local_30;
      local_30 = (ulong)(int)(uint)(uVar3 < local_30);
      local_10[1] = uVar3;
      iVar1 = local_28 + -2;
      if (local_28 + -2 < 1) break;
      uVar3 = local_18[2] + local_30;
      local_30 = (ulong)(int)(uint)(uVar3 < local_30);
      local_10[2] = uVar3;
      iVar1 = local_28 + -3;
      if (local_28 + -3 < 1) break;
      uVar3 = local_18[3] + local_30;
      local_30 = (ulong)(int)(uint)(uVar3 < local_30);
      local_10[3] = uVar3;
      local_28 = local_28 + -4;
      iVar1 = local_28;
      if (local_28 < 1) break;
      local_18 = local_18 + 4;
      local_10 = local_10 + 4;
    }
    local_28 = iVar1;
    if ((local_28 < 1) || (iVar2 <= local_28)) goto LAB_00118db2;
    iVar2 = iVar2 - local_28;
    if (iVar2 == 1) {
      local_10[1] = local_18[1];
      local_28 = local_28 + -1;
      if (0 < local_28) goto LAB_00118d48;
    }
    else {
      if (iVar2 == 2) {
LAB_00118d48:
        local_10[2] = local_18[2];
        local_28 = local_28 + -1;
        if (local_28 < 1) goto LAB_00118d94;
      }
      else if (iVar2 != 3) goto LAB_00118d94;
      local_10[3] = local_18[3];
      local_28 = local_28 + -1;
    }
LAB_00118d94:
    local_18 = local_18 + 4;
    local_10 = local_10 + 4;
LAB_00118db2:
    if (local_28 < 1) {
      return local_30;
    }
    while( true ) {
      *local_10 = *local_18;
      if (local_28 + -1 < 1) {
        return local_30;
      }
      local_10[1] = local_18[1];
      if (local_28 + -2 < 1) {
        return local_30;
      }
      local_10[2] = local_18[2];
      if (local_28 + -3 < 1) {
        return local_30;
      }
      local_10[3] = local_18[3];
      local_28 = local_28 + -4;
      if (local_28 < 1) break;
      local_18 = local_18 + 4;
      local_10 = local_10 + 4;
    }
    return local_30;
  }
  while (iVar2 = local_28, iVar1 = local_28, local_30 != 0) {
    uVar3 = local_30 + *local_20;
    local_30 = (ulong)(int)(uint)(uVar3 < local_30);
    *local_10 = uVar3;
    iVar1 = local_28 + 1;
    if (-1 < local_28 + 1) break;
    uVar3 = local_30 + local_20[1];
    local_30 = (ulong)(int)(uint)(uVar3 < local_30);
    local_10[1] = uVar3;
    iVar1 = local_28 + 2;
    if (-1 < local_28 + 2) break;
    uVar3 = local_30 + local_20[2];
    local_30 = (ulong)(int)(uint)(uVar3 < local_30);
    local_10[2] = uVar3;
    iVar1 = local_28 + 3;
    if (-1 < local_28 + 3) break;
    uVar3 = local_30 + local_20[3];
    local_30 = (ulong)(int)(uint)(uVar3 < local_30);
    local_10[3] = uVar3;
    local_28 = local_28 + 4;
    iVar1 = local_28;
    if (-1 < local_28) break;
    local_20 = local_20 + 4;
    local_10 = local_10 + 4;
  }
  local_28 = iVar1;
  if ((-1 < local_28) || (local_28 <= iVar2)) goto LAB_00118a97;
  iVar2 = local_28 - iVar2;
  if (iVar2 == 1) {
    local_10[1] = local_20[1];
    local_28 = local_28 + 1;
    if (local_28 < 0) goto LAB_00118a2d;
  }
  else {
    if (iVar2 == 2) {
LAB_00118a2d:
      local_10[2] = local_20[2];
      local_28 = local_28 + 1;
      if (-1 < local_28) goto LAB_00118a79;
    }
    else if (iVar2 != 3) goto LAB_00118a79;
    local_10[3] = local_20[3];
    local_28 = local_28 + 1;
  }
LAB_00118a79:
  local_20 = local_20 + 4;
  local_10 = local_10 + 4;
LAB_00118a97:
  if (local_28 < 0) {
    while (((*local_10 = *local_20, local_28 + 1 < 0 &&
            (local_10[1] = local_20[1], local_28 + 2 < 0)) &&
           (local_10[2] = local_20[2], local_28 + 3 < 0))) {
      local_10[3] = local_20[3];
      local_28 = local_28 + 4;
      if (-1 < local_28) {
        return local_30;
      }
      local_20 = local_20 + 4;
      local_10 = local_10 + 4;
    }
  }
  return local_30;
}

Assistant:

BN_ULONG bn_add_part_words(BN_ULONG *r,
                           const BN_ULONG *a, const BN_ULONG *b,
                           int cl, int dl)
{
    BN_ULONG c, l, t;

    assert(cl >= 0);
    c = bn_add_words(r, a, b, cl);

    if (dl == 0)
        return c;

    r += cl;
    a += cl;
    b += cl;

    if (dl < 0) {
        int save_dl = dl;
        while (c) {
            l = (c + b[0]) & BN_MASK2;
            c = (l < c);
            r[0] = l;
            if (++dl >= 0)
                break;

            l = (c + b[1]) & BN_MASK2;
            c = (l < c);
            r[1] = l;
            if (++dl >= 0)
                break;

            l = (c + b[2]) & BN_MASK2;
            c = (l < c);
            r[2] = l;
            if (++dl >= 0)
                break;

            l = (c + b[3]) & BN_MASK2;
            c = (l < c);
            r[3] = l;
            if (++dl >= 0)
                break;

            save_dl = dl;
            b += 4;
            r += 4;
        }
        if (dl < 0) {
            if (save_dl < dl) {
                switch (dl - save_dl) {
                case 1:
                    r[1] = b[1];
                    if (++dl >= 0)
                        break;
                case 2:
                    r[2] = b[2];
                    if (++dl >= 0)
                        break;
                case 3:
                    r[3] = b[3];
                    if (++dl >= 0)
                        break;
                }
                b += 4;
                r += 4;
            }
        }
        if (dl < 0) {
            for (;;) {
                r[0] = b[0];
                if (++dl >= 0)
                    break;
                r[1] = b[1];
                if (++dl >= 0)
                    break;
                r[2] = b[2];
                if (++dl >= 0)
                    break;
                r[3] = b[3];
                if (++dl >= 0)
                    break;

                b += 4;
                r += 4;
            }
        }
    } else {
        int save_dl = dl;
        while (c) {
            t = (a[0] + c) & BN_MASK2;
            c = (t < c);
            r[0] = t;
            if (--dl <= 0)
                break;

            t = (a[1] + c) & BN_MASK2;
            c = (t < c);
            r[1] = t;
            if (--dl <= 0)
                break;

            t = (a[2] + c) & BN_MASK2;
            c = (t < c);
            r[2] = t;
            if (--dl <= 0)
                break;

            t = (a[3] + c) & BN_MASK2;
            c = (t < c);
            r[3] = t;
            if (--dl <= 0)
                break;

            save_dl = dl;
            a += 4;
            r += 4;
        }
        if (dl > 0) {
            if (save_dl > dl) {
                switch (save_dl - dl) {
                case 1:
                    r[1] = a[1];
                    if (--dl <= 0)
                        break;
                case 2:
                    r[2] = a[2];
                    if (--dl <= 0)
                        break;
                case 3:
                    r[3] = a[3];
                    if (--dl <= 0)
                        break;
                }
                a += 4;
                r += 4;
            }
        }
        if (dl > 0) {
            for (;;) {
                r[0] = a[0];
                if (--dl <= 0)
                    break;
                r[1] = a[1];
                if (--dl <= 0)
                    break;
                r[2] = a[2];
                if (--dl <= 0)
                    break;
                r[3] = a[3];
                if (--dl <= 0)
                    break;

                a += 4;
                r += 4;
            }
        }
    }
    return c;
}